

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O1

asn_enc_rval_t *
OCTET_STRING_encode_xer
          (asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *sptr,int ilevel,
          xer_encoder_flags_e flags,asn_app_consume_bytes_f *cb,void *app_key)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  byte *pbVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  byte *pbVar11;
  ulong uVar12;
  char scratch [52];
  char local_68 [56];
  
  if ((sptr == (void *)0x0) ||
     ((pbVar7 = *sptr, pbVar7 == (byte *)0x0 && (*(int *)((long)sptr + 8) != 0)))) {
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = sptr;
    return __return_storage_ptr__;
  }
  iVar3 = *(int *)((long)sptr + 8);
  pbVar11 = pbVar7 + iVar3;
  if ((flags & XER_F_CANONICAL) == 0) {
    pcVar10 = local_68;
    pcVar9 = (char *)0x0;
    if (0 < iVar3) {
      iVar3 = 0;
      if (0 < ilevel) {
        iVar3 = ilevel;
      }
      pcVar10 = local_68;
      uVar12 = 0;
      do {
        if (((uVar12 & 0xf) == 0) && ((uVar12 != 0 || (0x10 < *(int *)((long)sptr + 8))))) {
          sVar8 = (long)pcVar10 - (long)local_68;
          iVar1 = (*cb)(local_68,sVar8,app_key);
          if (iVar1 < 0) goto LAB_00148c4e;
          pcVar9 = pcVar9 + sVar8;
          iVar1 = (*cb)("\n",1,app_key);
          uVar5 = 9;
          if (-1 < iVar1) {
            iVar1 = ilevel;
            if (0 < ilevel) {
              do {
                iVar2 = (*cb)("    ",4,app_key);
                if (iVar2 < 0) {
                  uVar5 = 9;
                  goto LAB_00148a58;
                }
                iVar1 = iVar1 + -1;
              } while (iVar1 != 0);
            }
            pcVar9 = pcVar9 + (iVar3 * 4 + 1);
            uVar5 = 0;
          }
LAB_00148a58:
          pcVar10 = local_68;
          if (uVar5 != 0) goto joined_r0x00148c2a;
        }
        *pcVar10 = "0123456789ABCDEF"[*pbVar7 >> 4];
        pcVar10[1] = "0123456789ABCDEF"[*pbVar7 & 0xf];
        pcVar10[2] = ' ';
        pcVar10 = pcVar10 + 3;
        pbVar7 = pbVar7 + 1;
        uVar12 = uVar12 + 1;
      } while (pbVar7 < pbVar11);
    }
    if (pcVar10 != local_68) {
      iVar3 = (*cb)(local_68,(size_t)(pcVar10 + ~(ulong)local_68),app_key);
      if (iVar3 < 0) {
LAB_00148c4e:
        __return_storage_ptr__->encoded = -1;
        __return_storage_ptr__->failed_type = td;
        __return_storage_ptr__->structure_ptr = sptr;
        return __return_storage_ptr__;
      }
      pcVar9 = pcVar10 + ~(ulong)local_68 + (long)pcVar9;
      if (0x10 < *(int *)((long)sptr + 8)) {
        iVar1 = (*cb)("\n",1,app_key);
        iVar3 = 9;
        if (-1 < iVar1) {
          iVar1 = 1;
          if (1 < ilevel) {
            iVar1 = ilevel;
          }
          iVar2 = iVar1 + -1;
          if (1 < ilevel) {
            do {
              iVar4 = (*cb)("    ",4,app_key);
              iVar3 = 9;
              if (iVar4 < 0) goto LAB_00148c38;
              iVar2 = iVar2 + -1;
            } while (iVar2 != 0);
          }
          pcVar9 = pcVar9 + ((iVar1 + -1) * 4 + 1);
          iVar3 = 0;
        }
LAB_00148c38:
        if (iVar3 == 9) goto LAB_00148c4e;
        if (iVar3 != 0) {
          return __return_storage_ptr__;
        }
      }
    }
  }
  else {
    if (iVar3 < 1) {
      sVar8 = 0;
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = (char *)0x0;
      sVar8 = 0;
      do {
        if (0x31 < (long)sVar8) {
          iVar3 = (*cb)(local_68,sVar8,app_key);
          if (iVar3 < 0) {
            uVar5 = 9;
            goto LAB_00148c1e;
          }
          pcVar9 = pcVar9 + sVar8;
          sVar8 = 0;
        }
        local_68[sVar8] = "0123456789ABCDEF"[*pbVar7 >> 4];
        local_68[sVar8 + 1] = "0123456789ABCDEF"[*pbVar7 & 0xf];
        sVar8 = sVar8 + 2;
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 < pbVar11);
    }
    iVar3 = (*cb)(local_68,sVar8,app_key);
    uVar5 = iVar3 >> 0x1f & 9;
    sVar6 = 0;
    if (-1 < iVar3) {
      sVar6 = sVar8;
    }
    pcVar9 = pcVar9 + sVar6;
LAB_00148c1e:
    if (uVar5 != 0) {
joined_r0x00148c2a:
      if (uVar5 != 9) {
        return __return_storage_ptr__;
      }
      goto LAB_00148c4e;
    }
  }
  __return_storage_ptr__->encoded = (ssize_t)pcVar9;
  __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
  __return_storage_ptr__->structure_ptr = (void *)0x0;
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
OCTET_STRING_encode_xer(asn_TYPE_descriptor_t *td, void *sptr,
	int ilevel, enum xer_encoder_flags_e flags,
		asn_app_consume_bytes_f *cb, void *app_key) {
	const char * const h2c = "0123456789ABCDEF";
	const OCTET_STRING_t *st = (const OCTET_STRING_t *)sptr;
	asn_enc_rval_t er;
	char scratch[16 * 3 + 4];
	char *p = scratch;
	uint8_t *buf;
	uint8_t *end;
	size_t i;

	if(!st || (!st->buf && st->size))
		ASN__ENCODE_FAILED;

	er.encoded = 0;

	/*
	 * Dump the contents of the buffer in hexadecimal.
	 */
	buf = st->buf;
	end = buf + st->size;
	if(flags & XER_F_CANONICAL) {
		char *scend = scratch + (sizeof(scratch) - 2);
		for(; buf < end; buf++) {
			if(p >= scend) {
				ASN__CALLBACK(scratch, p - scratch);
				er.encoded += p - scratch;
				p = scratch;
			}
			*p++ = h2c[(*buf >> 4) & 0x0F];
			*p++ = h2c[*buf & 0x0F];
		}

		ASN__CALLBACK(scratch, p-scratch);	/* Dump the rest */
		er.encoded += p - scratch;
	} else {
		for(i = 0; buf < end; buf++, i++) {
			if(!(i % 16) && (i || st->size > 16)) {
				ASN__CALLBACK(scratch, p-scratch);
				er.encoded += (p-scratch);
				p = scratch;
				ASN__TEXT_INDENT(1, ilevel);
			}
			*p++ = h2c[(*buf >> 4) & 0x0F];
			*p++ = h2c[*buf & 0x0F];
			*p++ = 0x20;
		}
		if(p - scratch) {
			p--;	/* Remove the tail space */
			ASN__CALLBACK(scratch, p-scratch); /* Dump the rest */
			er.encoded += p - scratch;
			if(st->size > 16)
				ASN__TEXT_INDENT(1, ilevel-1);
		}
	}

	ASN__ENCODED_OK(er);
cb_failed:
	ASN__ENCODE_FAILED;
}